

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  undefined1 local_40 [8];
  string user_msg_string;
  Message *user_msg_local;
  string *gtest_msg_local;
  
  user_msg_string.field_2._8_8_ = user_msg;
  Message::GetString_abi_cxx11_((string *)local_40,user_msg);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,gtest_msg);
  }
  else {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (gtest_msg);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    else {
      std::operator+(&local_70,gtest_msg,"\n");
      std::operator+(__return_storage_ptr__,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }
  if (gtest_msg.empty()) {
    return user_msg_string;
  }
  return gtest_msg + "\n" + user_msg_string;
}